

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

Node * __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_false>::NewLoopNode
          (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this,CharCount lower,
          CharCountOrFlag upper,bool isGreedy,Node *body)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *pPVar2;
  TrackAllocData local_90;
  code *local_68;
  undefined8 local_60;
  TrackAllocData local_58;
  Node *local_30;
  Node *body_local;
  CharCountOrFlag local_20;
  CharCount CStack_1c;
  bool isGreedy_local;
  CharCountOrFlag upper_local;
  CharCount lower_local;
  Parser<NullTerminatedUnicodeEncodingPolicy,_false> *this_local;
  
  if ((lower != 1) ||
     (this_local = (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *)body, upper != 1)) {
    local_30 = body;
    body_local._7_1_ = isGreedy;
    local_20 = upper;
    CStack_1c = lower;
    _upper_local = this;
    if ((lower == 0) && (upper == 0)) {
      pAVar1 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,(type_info *)&SimpleNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x41f);
      pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar1,&local_58);
      local_68 = Memory::ArenaAllocator::Alloc;
      local_60 = 0;
      pPVar2 = (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *)
               new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar1,0x3f67b0);
      SimpleNode::SimpleNode((SimpleNode *)pPVar2,Empty);
      this_local = pPVar2;
    }
    else {
      pAVar1 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_90,(type_info *)&LoopNode::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x421);
      pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar1,&local_90);
      pPVar2 = (Parser<NullTerminatedUnicodeEncodingPolicy,_false> *)
               new<Memory::ArenaAllocator>(0x50,(ArenaAllocator *)pAVar1,0x3f67b0);
      LoopNode::LoopNode((LoopNode *)pPVar2,CStack_1c,local_20,(bool)(body_local._7_1_ & 1),local_30
                        );
      this_local = pPVar2;
    }
  }
  return (Node *)this_local;
}

Assistant:

Node* Parser<P, IsLiteral>::NewLoopNode(CharCount lower, CharCountOrFlag upper, bool isGreedy, Node* body)
    {
        //
        // NOTE: We'd like to represent r? (i.e. r{0,1}) as r|<empty> since the loop representation has high overhead.
        //       HOWEVER if r contains a group definition and could match empty then we must execute as a loop
        //       so that group bindings are correctly reset on no progress (e.g.: /(a*)?/.exec("")). Thus we defer
        //       this optimization until pass 4 of the optimizer, at which point we know whether r could match empty.
        //
        if (lower == 1 && upper == 1)
            return body;
        else if (lower == 0 && upper == 0)
            // Loop is equivalent to empty. If the loop body contains group definitions they will have already been
            // counted towards the overall number of groups. The matcher will initialize their contents to
            // undefined, and since the loop body would never execute the inner groups could never be updated from
            // undefined.
            return Anew(ctAllocator, SimpleNode, Node::Empty);
        else
            return Anew(ctAllocator, LoopNode, lower, upper, isGreedy, body);
    }